

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  VkResult VVar5;
  GLFWwindow *handle;
  char *pcVar6;
  GLubyte *pGVar7;
  char *pcVar8;
  char **ppcVar9;
  VkPhysicalDevice *__ptr;
  undefined1 local_850 [8];
  VkPhysicalDeviceProperties pdp;
  uint32_t version;
  VkPhysicalDevice *pd;
  VkInstance instance;
  VkInstanceCreateInfo ici;
  VkApplicationInfo ai;
  char **re;
  uint local_480;
  uint32_t pd_count;
  uint32_t re_count;
  uint32_t i;
  uint32_t loader_version;
  GLint auxbuffers;
  GLint accumalphabits;
  GLint accumbluebits;
  GLint accumgreenbits;
  GLint accumredbits;
  GLint samplebuffers;
  GLint samples;
  GLint strategy;
  int robustness;
  GLint mask;
  GLint flags;
  option options [31];
  GLFWwindow *window;
  GLenum error;
  int list_layers;
  int list_extensions;
  GLint stencilbits;
  GLint depthbits;
  GLint alphabits;
  GLint bluebits;
  GLint greenbits;
  GLint redbits;
  int profile;
  int revision;
  int minor;
  int major;
  int client;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  bVar1 = false;
  bVar2 = false;
  _client = argv;
  argv_local._0_4_ = argc;
  memcpy(&mask,&PTR_anon_var_dwarf_23_00168190,0x3e0);
  iVar3 = valid_version();
  if (iVar3 == 0) {
    exit(1);
  }
  glfwSetErrorCallback(error_callback);
  glfwInitHint(0x51002,0);
  iVar3 = glfwInit();
  if (iVar3 == 0) {
    exit(1);
  }
  while (major = getopt_long((int)argv_local,_client,"a:b:c:dfhlm:n:p:s:v",(option *)&mask,
                             (int *)0x0), major != -1) {
    switch(major) {
    case 0:
    case 0x61:
      iVar3 = strcasecmp(optarg,"gl");
      if (iVar3 == 0) {
        glfwWindowHint(0x22001,0x30001);
      }
      else {
        iVar3 = strcasecmp(optarg,"es");
        if (iVar3 != 0) {
          usage();
          exit(1);
        }
        glfwWindowHint(0x22001,0x30002);
      }
      break;
    case 1:
    case 99:
      iVar3 = strcasecmp(optarg,"native");
      if (iVar3 == 0) {
        glfwWindowHint(0x2200b,0x36001);
      }
      else {
        iVar3 = strcasecmp(optarg,"egl");
        if (iVar3 == 0) {
          glfwWindowHint(0x2200b,0x36002);
        }
        else {
          iVar3 = strcasecmp(optarg,"osmesa");
          if (iVar3 != 0) {
            usage();
            exit(1);
          }
          glfwWindowHint(0x2200b,0x36003);
        }
      }
      break;
    case 2:
    case 0x62:
      iVar3 = strcasecmp(optarg,"none");
      if (iVar3 == 0) {
        glfwWindowHint(0x22009,0x35002);
      }
      else {
        iVar3 = strcasecmp(optarg,"flush");
        if (iVar3 != 0) {
          usage();
          exit(1);
        }
        glfwWindowHint(0x22009,0x35001);
      }
      break;
    case 3:
    case 100:
      glfwWindowHint(0x22007,1);
      break;
    case 4:
    case 0x66:
      glfwWindowHint(0x22006,1);
      break;
    case 5:
    case 0x68:
      usage();
      exit(0);
    case 6:
    case 0x6c:
      bVar1 = true;
      break;
    case 7:
      bVar2 = true;
      break;
    case 8:
    case 0x6d:
      iVar3 = atoi(optarg);
      glfwWindowHint(0x22002,iVar3);
      break;
    case 9:
    case 0x6e:
      iVar3 = atoi(optarg);
      glfwWindowHint(0x22003,iVar3);
      break;
    case 10:
    case 0x70:
      iVar3 = strcasecmp(optarg,"core");
      if (iVar3 == 0) {
        glfwWindowHint(0x22008,0x32001);
      }
      else {
        iVar3 = strcasecmp(optarg,"compat");
        if (iVar3 != 0) {
          usage();
          exit(1);
        }
        glfwWindowHint(0x22008,0x32002);
      }
      break;
    case 0xb:
    case 0x73:
      iVar3 = strcasecmp(optarg,"none");
      if (iVar3 == 0) {
        glfwWindowHint(0x22005,0x31001);
      }
      else {
        iVar3 = strcasecmp(optarg,"lose");
        if (iVar3 != 0) {
          usage();
          exit(1);
        }
        glfwWindowHint(0x22005,0x31002);
      }
      break;
    case 0xc:
    case 0x76:
      print_version();
      exit(0);
    case 0xd:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x21001,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x21001,iVar3);
      }
      break;
    case 0xe:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x21002,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x21002,iVar3);
      }
      break;
    case 0xf:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x21003,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x21003,iVar3);
      }
      break;
    case 0x10:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x21004,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x21004,iVar3);
      }
      break;
    case 0x11:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x21005,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x21005,iVar3);
      }
      break;
    case 0x12:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x21006,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x21006,iVar3);
      }
      break;
    case 0x13:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x21007,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x21007,iVar3);
      }
      break;
    case 0x14:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x21008,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x21008,iVar3);
      }
      break;
    case 0x15:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x21009,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x21009,iVar3);
      }
      break;
    case 0x16:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x2100a,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x2100a,iVar3);
      }
      break;
    case 0x17:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x2100b,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x2100b,iVar3);
      }
      break;
    case 0x18:
      iVar3 = strcmp(optarg,"-");
      if (iVar3 == 0) {
        glfwWindowHint(0x2100d,-1);
      }
      else {
        iVar3 = atoi(optarg);
        glfwWindowHint(0x2100d,iVar3);
      }
      break;
    case 0x19:
      glfwWindowHint(0x2100c,1);
      break;
    case 0x1a:
      glfwWindowHint(0x2100e,1);
      break;
    case 0x1b:
      glfwWindowHint(0x21010,0);
      break;
    case 0x1c:
      glfwWindowHint(0x2200a,1);
      break;
    case 0x1d:
      glfwWindowHint(0x23003,1);
      break;
    default:
      usage();
      exit(1);
    }
  }
  print_version();
  glfwWindowHint(0x20004,0);
  handle = glfwCreateWindow(200,200,"Version",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwMakeContextCurrent(handle);
  gladLoadGL(glfwGetProcAddress);
  GVar4 = (*glad_glGetError)();
  if (GVar4 != 0) {
    printf("*** OpenGL error after make current: 0x%08x ***\n",(ulong)GVar4);
  }
  minor = glfwGetWindowAttrib(handle,0x22001);
  revision = glfwGetWindowAttrib(handle,0x22002);
  profile = glfwGetWindowAttrib(handle,0x22003);
  redbits = glfwGetWindowAttrib(handle,0x22004);
  greenbits = glfwGetWindowAttrib(handle,0x22008);
  pcVar6 = get_api_name(minor);
  pGVar7 = (*glad_glGetString)(0x1f02);
  printf("%s context version string: \"%s\"\n",pcVar6,pGVar7);
  pcVar6 = get_api_name(minor);
  printf("%s context version parsed by GLFW: %u.%u.%u\n",pcVar6,(ulong)(uint)revision,
         (ulong)(uint)profile,(ulong)(uint)redbits);
  if (minor == 0x30001) {
    if (2 < revision) {
      (*glad_glGetIntegerv)(0x821e,&robustness);
      pcVar6 = get_api_name(minor);
      printf("%s context flags (0x%08x):",pcVar6,(ulong)(uint)robustness);
      if ((robustness & 1U) != 0) {
        printf(" forward-compatible");
      }
      if ((robustness & 2U) != 0) {
        printf(" debug");
      }
      if ((robustness & 4U) != 0) {
        printf(" robustness");
      }
      if ((robustness & 8U) != 0) {
        printf(" no-error");
      }
      putchar(10);
      pcVar6 = get_api_name(minor);
      printf("%s context flags parsed by GLFW:",pcVar6);
      iVar3 = glfwGetWindowAttrib(handle,0x22006);
      if (iVar3 != 0) {
        printf(" forward-compatible");
      }
      iVar3 = glfwGetWindowAttrib(handle,0x22007);
      if (iVar3 != 0) {
        printf(" debug");
      }
      iVar3 = glfwGetWindowAttrib(handle,0x22005);
      if (iVar3 == 0x31002) {
        printf(" robustness");
      }
      iVar3 = glfwGetWindowAttrib(handle,0x2200a);
      if (iVar3 != 0) {
        printf(" no-error");
      }
      putchar(10);
    }
    if ((3 < revision) || ((revision == 3 && (1 < profile)))) {
      (*glad_glGetIntegerv)(0x9126,&strategy);
      pcVar6 = get_api_name(minor);
      pcVar8 = get_profile_name_gl(strategy);
      printf("%s profile mask (0x%08x): %s\n",pcVar6,(ulong)(uint)strategy,pcVar8);
      pcVar6 = get_api_name(minor);
      pcVar8 = get_profile_name_glfw(greenbits);
      printf("%s profile mask parsed by GLFW: %s\n",pcVar6,pcVar8);
    }
    if (GLAD_GL_ARB_robustness != 0) {
      samples = glfwGetWindowAttrib(handle,0x22005);
      (*glad_glGetIntegerv)(0x8256,&samplebuffers);
      pcVar6 = get_api_name(minor);
      pcVar8 = get_strategy_name_gl(samplebuffers);
      printf("%s robustness strategy (0x%08x): %s\n",pcVar6,(ulong)(uint)samplebuffers,pcVar8);
      pcVar6 = get_api_name(minor);
      pcVar8 = get_strategy_name_glfw(samples);
      printf("%s robustness strategy parsed by GLFW: %s\n",pcVar6,pcVar8);
    }
  }
  pcVar6 = get_api_name(minor);
  pGVar7 = (*glad_glGetString)(0x1f01);
  printf("%s context renderer string: \"%s\"\n",pcVar6,pGVar7);
  pcVar6 = get_api_name(minor);
  pGVar7 = (*glad_glGetString)(0x1f00);
  printf("%s context vendor string: \"%s\"\n",pcVar6,pGVar7);
  if (1 < revision) {
    pcVar6 = get_api_name(minor);
    pGVar7 = (*glad_glGetString)(0x8b8c);
    printf("%s context shading language version: \"%s\"\n",pcVar6,pGVar7);
  }
  pcVar6 = get_api_name(minor);
  printf("%s framebuffer:\n",pcVar6);
  if ((minor == 0x30001) && (greenbits == 0x32001)) {
    (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8212,&bluebits);
    (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8213,&alphabits);
    (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8214,&depthbits);
    (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8215,&stencilbits);
    (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x1801,0x8216,&list_extensions);
    (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x1802,0x8217,&list_layers);
  }
  else {
    (*glad_glGetIntegerv)(0xd52,&bluebits);
    (*glad_glGetIntegerv)(0xd53,&alphabits);
    (*glad_glGetIntegerv)(0xd54,&depthbits);
    (*glad_glGetIntegerv)(0xd55,&stencilbits);
    (*glad_glGetIntegerv)(0xd56,&list_extensions);
    (*glad_glGetIntegerv)(0xd57,&list_layers);
  }
  printf(" red: %u green: %u blue: %u alpha: %u depth: %u stencil: %u\n",(ulong)(uint)bluebits,
         (ulong)(uint)alphabits,(ulong)(uint)depthbits,(ulong)(uint)stencilbits,
         (ulong)(uint)list_extensions,list_layers);
  if ((((minor == 0x30002) || (GLAD_GL_ARB_multisample != 0)) || (1 < revision)) || (2 < profile)) {
    (*glad_glGetIntegerv)(0x80a9,&accumredbits);
    (*glad_glGetIntegerv)(0x80a8,&accumgreenbits);
    printf(" samples: %u sample buffers: %u\n",(ulong)(uint)accumredbits,(ulong)(uint)accumgreenbits
          );
  }
  if ((minor == 0x30001) && (greenbits != 0x32001)) {
    (*glad_glGetIntegerv)(0xd58,&accumbluebits);
    (*glad_glGetIntegerv)(0xd59,&accumalphabits);
    (*glad_glGetIntegerv)(0xd5a,&auxbuffers);
    (*glad_glGetIntegerv)(0xd5b,(GLint *)&loader_version);
    (*glad_glGetIntegerv)(0xc00,(GLint *)&i);
    printf(" accum red: %u accum green: %u accum blue: %u accum alpha: %u aux buffers: %u\n",
           (ulong)(uint)accumbluebits,(ulong)(uint)accumalphabits,(ulong)(uint)auxbuffers,
           (ulong)loader_version,(ulong)i);
  }
  if (bVar1) {
    list_context_extensions(minor,revision,profile);
  }
  glfwVulkanSupported();
  printf("Vulkan loader: %s\n");
  iVar3 = glfwVulkanSupported();
  if (iVar3 != 0) {
    re_count = 0x400000;
    memset(&ici.ppEnabledExtensionNames,0,0x30);
    memset(&instance,0,0x40);
    gladLoadVulkanUserPtr((VkPhysicalDevice)0x0,glad_vulkan_callback,(void *)0x0);
    if ((glad_vkEnumerateInstanceVersion != (PFN_vkEnumerateInstanceVersion)0x0) &&
       (VVar5 = (*glad_vkEnumerateInstanceVersion)((uint32_t *)&pdp.field_0x334),
       VVar5 == VK_SUCCESS)) {
      re_count = pdp._820_4_;
    }
    printf("Vulkan loader API version: %i.%i\n",(ulong)(re_count >> 0x16),
           (ulong)(re_count >> 0xc & 0x3ff));
    ppcVar9 = glfwGetRequiredInstanceExtensions(&local_480);
    printf("Vulkan required instance extensions:");
    if (ppcVar9 == (char **)0x0) {
      printf(" missing\n");
    }
    else {
      for (pd_count = 0; pd_count < local_480; pd_count = pd_count + 1) {
        printf(" %s",ppcVar9[pd_count]);
      }
      putchar(10);
    }
    if (bVar1) {
      list_vulkan_instance_extensions();
    }
    if (bVar2) {
      list_vulkan_instance_layers();
    }
    ici.ppEnabledExtensionNames._0_4_ = 0;
    instance._0_4_ = 1;
    ici._16_8_ = &ici.ppEnabledExtensionNames;
    ici.ppEnabledLayerNames._0_4_ = local_480;
    ici._48_8_ = ppcVar9;
    VVar5 = (*glad_vkCreateInstance)
                      ((VkInstanceCreateInfo *)&instance,(VkAllocationCallbacks *)0x0,
                       (VkInstance *)&pd);
    if (VVar5 != VK_SUCCESS) {
      glfwTerminate();
      exit(1);
    }
    gladLoadVulkanUserPtr((VkPhysicalDevice)0x0,glad_vulkan_callback,pd);
    VVar5 = (*glad_vkEnumeratePhysicalDevices)
                      ((VkInstance)pd,(uint32_t *)((long)&re + 4),(VkPhysicalDevice *)0x0);
    if (VVar5 != VK_SUCCESS) {
      (*glad_vkDestroyInstance)((VkInstance)pd,(VkAllocationCallbacks *)0x0);
      glfwTerminate();
      exit(1);
    }
    __ptr = (VkPhysicalDevice *)calloc((ulong)re._4_4_,8);
    VVar5 = (*glad_vkEnumeratePhysicalDevices)((VkInstance)pd,(uint32_t *)((long)&re + 4),__ptr);
    if (VVar5 != VK_SUCCESS) {
      free(__ptr);
      (*glad_vkDestroyInstance)((VkInstance)pd,(VkAllocationCallbacks *)0x0);
      glfwTerminate();
      exit(1);
    }
    for (pd_count = 0; pd_count < re._4_4_; pd_count = pd_count + 1) {
      (*glad_vkGetPhysicalDeviceProperties)(__ptr[pd_count],(VkPhysicalDeviceProperties *)local_850)
      ;
      pcVar6 = get_device_type_name(pdp.vendorID);
      printf("Vulkan %s device: \"%s\" API version %i.%i\n",pcVar6,&pdp.deviceID,
             (ulong)((uint)local_850._0_4_ >> 0x16),(ulong)((uint)local_850._0_4_ >> 0xc & 0x3ff));
      if (bVar1) {
        list_vulkan_device_extensions((VkInstance)pd,__ptr[pd_count]);
      }
      if (bVar2) {
        list_vulkan_device_layers((VkInstance)pd,__ptr[pd_count]);
      }
    }
    free(__ptr);
    (*glad_vkDestroyInstance)((VkInstance)pd,(VkAllocationCallbacks *)0x0);
  }
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, client, major, minor, revision, profile;
    GLint redbits, greenbits, bluebits, alphabits, depthbits, stencilbits;
    int list_extensions = GLFW_FALSE, list_layers = GLFW_FALSE;
    GLenum error;
    GLFWwindow* window;

    enum { CLIENT, CONTEXT, BEHAVIOR, DEBUG_CONTEXT, FORWARD, HELP,
           EXTENSIONS, LAYERS,
           MAJOR, MINOR, PROFILE, ROBUSTNESS, VERSION,
           REDBITS, GREENBITS, BLUEBITS, ALPHABITS, DEPTHBITS, STENCILBITS,
           ACCUMREDBITS, ACCUMGREENBITS, ACCUMBLUEBITS, ACCUMALPHABITS,
           AUXBUFFERS, SAMPLES, STEREO, SRGB, SINGLEBUFFER, NOERROR_SRSLY,
           GRAPHICS_SWITCHING };
    const struct option options[] =
    {
        { "behavior",           1, NULL, BEHAVIOR },
        { "client-api",         1, NULL, CLIENT },
        { "context-api",        1, NULL, CONTEXT },
        { "debug",              0, NULL, DEBUG_CONTEXT },
        { "forward",            0, NULL, FORWARD },
        { "help",               0, NULL, HELP },
        { "list-extensions",    0, NULL, EXTENSIONS },
        { "list-layers",        0, NULL, LAYERS },
        { "major",              1, NULL, MAJOR },
        { "minor",              1, NULL, MINOR },
        { "profile",            1, NULL, PROFILE },
        { "robustness",         1, NULL, ROBUSTNESS },
        { "version",            0, NULL, VERSION },
        { "red-bits",           1, NULL, REDBITS },
        { "green-bits",         1, NULL, GREENBITS },
        { "blue-bits",          1, NULL, BLUEBITS },
        { "alpha-bits",         1, NULL, ALPHABITS },
        { "depth-bits",         1, NULL, DEPTHBITS },
        { "stencil-bits",       1, NULL, STENCILBITS },
        { "accum-red-bits",     1, NULL, ACCUMREDBITS },
        { "accum-green-bits",   1, NULL, ACCUMGREENBITS },
        { "accum-blue-bits",    1, NULL, ACCUMBLUEBITS },
        { "accum-alpha-bits",   1, NULL, ACCUMALPHABITS },
        { "aux-buffers",        1, NULL, AUXBUFFERS },
        { "samples",            1, NULL, SAMPLES },
        { "stereo",             0, NULL, STEREO },
        { "srgb",               0, NULL, SRGB },
        { "singlebuffer",       0, NULL, SINGLEBUFFER },
        { "no-error",           0, NULL, NOERROR_SRSLY },
        { "graphics-switching", 0, NULL, GRAPHICS_SWITCHING },
        { NULL, 0, NULL, 0 }
    };

    // Initialize GLFW and create window

    if (!valid_version())
        exit(EXIT_FAILURE);

    glfwSetErrorCallback(error_callback);

    glfwInitHint(GLFW_COCOA_MENUBAR, GLFW_FALSE);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    while ((ch = getopt_long(argc, argv, "a:b:c:dfhlm:n:p:s:v", options, NULL)) != -1)
    {
        switch (ch)
        {
            case 'a':
            case CLIENT:
                if (strcasecmp(optarg, API_NAME_OPENGL) == 0)
                    glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_API);
                else if (strcasecmp(optarg, API_NAME_OPENGL_ES) == 0)
                    glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'b':
            case BEHAVIOR:
                if (strcasecmp(optarg, BEHAVIOR_NAME_NONE) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_RELEASE_BEHAVIOR,
                                   GLFW_RELEASE_BEHAVIOR_NONE);
                }
                else if (strcasecmp(optarg, BEHAVIOR_NAME_FLUSH) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_RELEASE_BEHAVIOR,
                                   GLFW_RELEASE_BEHAVIOR_FLUSH);
                }
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'c':
            case CONTEXT:
                if (strcasecmp(optarg, API_NAME_NATIVE) == 0)
                    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_NATIVE_CONTEXT_API);
                else if (strcasecmp(optarg, API_NAME_EGL) == 0)
                    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
                else if (strcasecmp(optarg, API_NAME_OSMESA) == 0)
                    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_OSMESA_CONTEXT_API);
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'd':
            case DEBUG_CONTEXT:
                glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GLFW_TRUE);
                break;
            case 'f':
            case FORWARD:
                glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_TRUE);
                break;
            case 'h':
            case HELP:
                usage();
                exit(EXIT_SUCCESS);
            case 'l':
            case EXTENSIONS:
                list_extensions = GLFW_TRUE;
                break;
            case LAYERS:
                list_layers = GLFW_TRUE;
                break;
            case 'm':
            case MAJOR:
                glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, atoi(optarg));
                break;
            case 'n':
            case MINOR:
                glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, atoi(optarg));
                break;
            case 'p':
            case PROFILE:
                if (strcasecmp(optarg, PROFILE_NAME_CORE) == 0)
                {
                    glfwWindowHint(GLFW_OPENGL_PROFILE,
                                   GLFW_OPENGL_CORE_PROFILE);
                }
                else if (strcasecmp(optarg, PROFILE_NAME_COMPAT) == 0)
                {
                    glfwWindowHint(GLFW_OPENGL_PROFILE,
                                   GLFW_OPENGL_COMPAT_PROFILE);
                }
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 's':
            case ROBUSTNESS:
                if (strcasecmp(optarg, STRATEGY_NAME_NONE) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_ROBUSTNESS,
                                   GLFW_NO_RESET_NOTIFICATION);
                }
                else if (strcasecmp(optarg, STRATEGY_NAME_LOSE) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_ROBUSTNESS,
                                   GLFW_LOSE_CONTEXT_ON_RESET);
                }
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'v':
            case VERSION:
                print_version();
                exit(EXIT_SUCCESS);
            case REDBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_RED_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_RED_BITS, atoi(optarg));
                break;
            case GREENBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_GREEN_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_GREEN_BITS, atoi(optarg));
                break;
            case BLUEBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_BLUE_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_BLUE_BITS, atoi(optarg));
                break;
            case ALPHABITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ALPHA_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ALPHA_BITS, atoi(optarg));
                break;
            case DEPTHBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_DEPTH_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_DEPTH_BITS, atoi(optarg));
                break;
            case STENCILBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_STENCIL_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_STENCIL_BITS, atoi(optarg));
                break;
            case ACCUMREDBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_RED_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_RED_BITS, atoi(optarg));
                break;
            case ACCUMGREENBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_GREEN_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_GREEN_BITS, atoi(optarg));
                break;
            case ACCUMBLUEBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_BLUE_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_BLUE_BITS, atoi(optarg));
                break;
            case ACCUMALPHABITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_ALPHA_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_ALPHA_BITS, atoi(optarg));
                break;
            case AUXBUFFERS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_AUX_BUFFERS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_AUX_BUFFERS, atoi(optarg));
                break;
            case SAMPLES:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_SAMPLES, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_SAMPLES, atoi(optarg));
                break;
            case STEREO:
                glfwWindowHint(GLFW_STEREO, GLFW_TRUE);
                break;
            case SRGB:
                glfwWindowHint(GLFW_SRGB_CAPABLE, GLFW_TRUE);
                break;
            case SINGLEBUFFER:
                glfwWindowHint(GLFW_DOUBLEBUFFER, GLFW_FALSE);
                break;
            case NOERROR_SRSLY:
                glfwWindowHint(GLFW_CONTEXT_NO_ERROR, GLFW_TRUE);
                break;
            case GRAPHICS_SWITCHING:
                glfwWindowHint(GLFW_COCOA_GRAPHICS_SWITCHING, GLFW_TRUE);
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    print_version();

    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    window = glfwCreateWindow(200, 200, "Version", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    error = glGetError();
    if (error != GL_NO_ERROR)
        printf("*** OpenGL error after make current: 0x%08x ***\n", error);

    // Report client API version

    client = glfwGetWindowAttrib(window, GLFW_CLIENT_API);
    major = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MAJOR);
    minor = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MINOR);
    revision = glfwGetWindowAttrib(window, GLFW_CONTEXT_REVISION);
    profile = glfwGetWindowAttrib(window, GLFW_OPENGL_PROFILE);

    printf("%s context version string: \"%s\"\n",
           get_api_name(client),
           glGetString(GL_VERSION));

    printf("%s context version parsed by GLFW: %u.%u.%u\n",
           get_api_name(client),
           major, minor, revision);

    // Report client API context properties

    if (client == GLFW_OPENGL_API)
    {
        if (major >= 3)
        {
            GLint flags;

            glGetIntegerv(GL_CONTEXT_FLAGS, &flags);
            printf("%s context flags (0x%08x):", get_api_name(client), flags);

            if (flags & GL_CONTEXT_FLAG_FORWARD_COMPATIBLE_BIT)
                printf(" forward-compatible");
            if (flags & 2/*GL_CONTEXT_FLAG_DEBUG_BIT*/)
                printf(" debug");
            if (flags & GL_CONTEXT_FLAG_ROBUST_ACCESS_BIT_ARB)
                printf(" robustness");
            if (flags & 8/*GL_CONTEXT_FLAG_NO_ERROR_BIT_KHR*/)
                printf(" no-error");
            putchar('\n');

            printf("%s context flags parsed by GLFW:", get_api_name(client));

            if (glfwGetWindowAttrib(window, GLFW_OPENGL_FORWARD_COMPAT))
                printf(" forward-compatible");
            if (glfwGetWindowAttrib(window, GLFW_OPENGL_DEBUG_CONTEXT))
                printf(" debug");
            if (glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS) == GLFW_LOSE_CONTEXT_ON_RESET)
                printf(" robustness");
            if (glfwGetWindowAttrib(window, GLFW_CONTEXT_NO_ERROR))
                printf(" no-error");
            putchar('\n');
        }

        if (major >= 4 || (major == 3 && minor >= 2))
        {
            GLint mask;
            glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &mask);

            printf("%s profile mask (0x%08x): %s\n",
                   get_api_name(client),
                   mask,
                   get_profile_name_gl(mask));

            printf("%s profile mask parsed by GLFW: %s\n",
                   get_api_name(client),
                   get_profile_name_glfw(profile));
        }

        if (GLAD_GL_ARB_robustness)
        {
            const int robustness = glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS);
            GLint strategy;
            glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY_ARB, &strategy);

            printf("%s robustness strategy (0x%08x): %s\n",
                   get_api_name(client),
                   strategy,
                   get_strategy_name_gl(strategy));

            printf("%s robustness strategy parsed by GLFW: %s\n",
                   get_api_name(client),
                   get_strategy_name_glfw(robustness));
        }
    }

    printf("%s context renderer string: \"%s\"\n",
           get_api_name(client),
           glGetString(GL_RENDERER));
    printf("%s context vendor string: \"%s\"\n",
           get_api_name(client),
           glGetString(GL_VENDOR));

    if (major >= 2)
    {
        printf("%s context shading language version: \"%s\"\n",
               get_api_name(client),
               glGetString(GL_SHADING_LANGUAGE_VERSION));
    }

    printf("%s framebuffer:\n", get_api_name(client));

    if (client == GLFW_OPENGL_API && profile == GLFW_OPENGL_CORE_PROFILE)
    {
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,
                                              &redbits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,
                                              &greenbits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,
                                              &bluebits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,
                                              &alphabits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_DEPTH,
                                              GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,
                                              &depthbits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_STENCIL,
                                              GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,
                                              &stencilbits);
    }
    else
    {
        glGetIntegerv(GL_RED_BITS, &redbits);
        glGetIntegerv(GL_GREEN_BITS, &greenbits);
        glGetIntegerv(GL_BLUE_BITS, &bluebits);
        glGetIntegerv(GL_ALPHA_BITS, &alphabits);
        glGetIntegerv(GL_DEPTH_BITS, &depthbits);
        glGetIntegerv(GL_STENCIL_BITS, &stencilbits);
    }

    printf(" red: %u green: %u blue: %u alpha: %u depth: %u stencil: %u\n",
           redbits, greenbits, bluebits, alphabits, depthbits, stencilbits);

    if (client == GLFW_OPENGL_ES_API ||
        GLAD_GL_ARB_multisample ||
        major > 1 || minor >= 3)
    {
        GLint samples, samplebuffers;
        glGetIntegerv(GL_SAMPLES, &samples);
        glGetIntegerv(GL_SAMPLE_BUFFERS, &samplebuffers);

        printf(" samples: %u sample buffers: %u\n", samples, samplebuffers);
    }

    if (client == GLFW_OPENGL_API && profile != GLFW_OPENGL_CORE_PROFILE)
    {
        GLint accumredbits, accumgreenbits, accumbluebits, accumalphabits;
        GLint auxbuffers;

        glGetIntegerv(GL_ACCUM_RED_BITS, &accumredbits);
        glGetIntegerv(GL_ACCUM_GREEN_BITS, &accumgreenbits);
        glGetIntegerv(GL_ACCUM_BLUE_BITS, &accumbluebits);
        glGetIntegerv(GL_ACCUM_ALPHA_BITS, &accumalphabits);
        glGetIntegerv(GL_AUX_BUFFERS, &auxbuffers);

        printf(" accum red: %u accum green: %u accum blue: %u accum alpha: %u aux buffers: %u\n",
               accumredbits, accumgreenbits, accumbluebits, accumalphabits, auxbuffers);
    }

    if (list_extensions)
        list_context_extensions(client, major, minor);

    printf("Vulkan loader: %s\n",
           glfwVulkanSupported() ? "available" : "missing");

    if (glfwVulkanSupported())
    {
        uint32_t loader_version = VK_API_VERSION_1_0;
        uint32_t i, re_count, pd_count;
        const char** re;
        VkApplicationInfo ai = {0};
        VkInstanceCreateInfo ici = {0};
        VkInstance instance;
        VkPhysicalDevice* pd;

        gladLoadVulkanUserPtr(NULL, glad_vulkan_callback, NULL);

        if (vkEnumerateInstanceVersion)
        {
            uint32_t version;
            if (vkEnumerateInstanceVersion(&version) == VK_SUCCESS)
                loader_version = version;
        }

        printf("Vulkan loader API version: %i.%i\n",
               VK_VERSION_MAJOR(loader_version),
               VK_VERSION_MINOR(loader_version));

        re = glfwGetRequiredInstanceExtensions(&re_count);

        printf("Vulkan required instance extensions:");
        if (re)
        {
            for (i = 0;  i < re_count;  i++)
                printf(" %s", re[i]);
            putchar('\n');
        }
        else
            printf(" missing\n");

        if (list_extensions)
            list_vulkan_instance_extensions();

        if (list_layers)
            list_vulkan_instance_layers();

        ai.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        ai.pApplicationName = "glfwinfo";
        ai.applicationVersion = VK_MAKE_VERSION(GLFW_VERSION_MAJOR,
                                                GLFW_VERSION_MINOR,
                                                GLFW_VERSION_REVISION);

        if (loader_version >= VK_API_VERSION_1_1)
            ai.apiVersion = VK_API_VERSION_1_1;
        else
            ai.apiVersion = VK_API_VERSION_1_0;

        ici.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
        ici.pApplicationInfo = &ai;
        ici.enabledExtensionCount = re_count;
        ici.ppEnabledExtensionNames = re;

        if (vkCreateInstance(&ici, NULL, &instance) != VK_SUCCESS)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        gladLoadVulkanUserPtr(NULL, glad_vulkan_callback, instance);

        if (vkEnumeratePhysicalDevices(instance, &pd_count, NULL) != VK_SUCCESS)
        {
            vkDestroyInstance(instance, NULL);
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        pd = calloc(pd_count, sizeof(VkPhysicalDevice));

        if (vkEnumeratePhysicalDevices(instance, &pd_count, pd) != VK_SUCCESS)
        {
            free(pd);
            vkDestroyInstance(instance, NULL);
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        for (i = 0;  i < pd_count;  i++)
        {
            VkPhysicalDeviceProperties pdp;

            vkGetPhysicalDeviceProperties(pd[i], &pdp);

            printf("Vulkan %s device: \"%s\" API version %i.%i\n",
                   get_device_type_name(pdp.deviceType),
                   pdp.deviceName,
                   VK_VERSION_MAJOR(pdp.apiVersion),
                   VK_VERSION_MINOR(pdp.apiVersion));

            if (list_extensions)
                list_vulkan_device_extensions(instance, pd[i]);

            if (list_layers)
                list_vulkan_device_layers(instance, pd[i]);
        }

        free(pd);
        vkDestroyInstance(instance, NULL);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}